

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-simultaneous.c
# Opt level: O3

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *handle;
  int iVar1;
  void *pvVar2;
  undefined8 *extraout_RDX;
  long lVar3;
  long *plVar4;
  undefined8 *__size;
  long *plVar5;
  uv_shutdown_t *puVar6;
  long lVar7;
  uv_buf_t uVar8;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_buf_t send_bufs [4096];
  undefined8 uStack_10060;
  code *pcStack_10058;
  code *pcStack_10050;
  long alStack_10048 [2];
  uv_buf_t auStack_10038 [4096];
  
  handle = connect_req.handle;
  plVar5 = alStack_10048;
  if (req == &connect_req) {
    auStack_10038[0].base = (char *)(long)status;
    alStack_10048[0] = 0;
    if (auStack_10038[0].base != (char *)0x0) goto LAB_001ce637;
    connect_cb_called = connect_cb_called + 1;
    lVar7 = 0;
    do {
      alStack_10048[0] = 0;
      lVar3 = 0;
      do {
        pcStack_10050 = (code *)0x1ce540;
        uVar8 = uv_buf_init(send_buffer + bytes_sent,0x2728);
        *(char **)((long)&auStack_10038[0].base + lVar3) = uVar8.base;
        *(size_t *)((long)&auStack_10038[0].len + lVar3) = uVar8.len;
        bytes_sent = bytes_sent + 0x2728;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x10000);
      pcStack_10050 = (code *)0x1ce58c;
      iVar1 = uv_write(write_reqs + lVar7,handle,auStack_10038,0x1000,write_cb);
      alStack_10048[0] = (long)iVar1;
      alStack_10048[1] = 0;
      if (alStack_10048[0] != 0) {
        pcStack_10050 = (code *)0x1ce632;
        connect_cb_cold_3();
        goto LAB_001ce632;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    pcStack_10050 = (code *)0x1ce5c9;
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    alStack_10048[0] = (long)iVar1;
    alStack_10048[1] = 0;
    if (alStack_10048[0] != 0) goto LAB_001ce644;
    pcStack_10050 = (code *)0x1ce5f9;
    iVar1 = uv_read_start(handle,alloc_cb,read_cb);
    alStack_10048[0] = (long)iVar1;
    alStack_10048[1] = 0;
    if (alStack_10048[0] == 0) {
      return;
    }
  }
  else {
LAB_001ce632:
    pcStack_10050 = (code *)0x1ce637;
    connect_cb_cold_1();
LAB_001ce637:
    pcStack_10050 = (code *)0x1ce644;
    connect_cb_cold_2();
LAB_001ce644:
    pcStack_10050 = (code *)0x1ce651;
    connect_cb_cold_4();
  }
  plVar4 = alStack_10048 + 1;
  pcStack_10050 = write_cb;
  connect_cb_cold_5();
  if (plVar5 == (long *)0x0) {
    pcStack_10058 = (code *)0x1ce680;
    write_cb_cold_2();
  }
  else if ((int)plVar4 == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  iVar1 = (int)plVar4;
  puVar6 = (uv_shutdown_t *)((ulong)plVar4 & 0xffffffff);
  pcStack_10058 = shutdown_cb;
  write_cb_cold_1();
  if (puVar6 == &shutdown_req) {
    pcStack_10058 = (code *)(long)iVar1;
    uStack_10060 = 0;
    if (pcStack_10058 != (code *)0x0) goto LAB_001ce70a;
    pcStack_10058 = (code *)(shutdown_req.handle)->write_queue_size;
    uStack_10060 = 0;
    if (pcStack_10058 == (code *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      pcStack_10058 = (code *)(long)write_cb_called;
      uStack_10060 = 3;
      if (pcStack_10058 == (code *)0x3) {
        return;
      }
      goto LAB_001ce728;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_001ce70a:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_001ce728:
  __size = &uStack_10060;
  shutdown_cb_cold_4();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void connect_cb(uv_connect_t *req, int status) {
  ASSERT_OK(status);
  ASSERT_PTR_EQ(req, &connect_req);

  /* Start reading from our connection so we can receive the EOF.  */
  ASSERT_OK(uv_read_start((uv_stream_t*)&tcp, alloc_cb, read_cb));

  /* Check error handling. */
  ASSERT_EQ(UV_EALREADY, uv_read_start((uv_stream_t*)&tcp, alloc_cb, read_cb));
  ASSERT_EQ(UV_EINVAL, uv_read_start(NULL, alloc_cb, read_cb));
  ASSERT_EQ(UV_EINVAL, uv_read_start((uv_stream_t*)&tcp, NULL, read_cb));
  ASSERT_EQ(UV_EINVAL, uv_read_start((uv_stream_t*)&tcp, alloc_cb, NULL));

  /*
   * Write the letter 'Q' and 'QSS` to gracefully kill the echo-server. This
   * will not effect our connection.
   */
  ASSERT_EQ(qbuf.len, uv_try_write((uv_stream_t*) &tcp, &qbuf, 1));

  called_connect_cb++;
  ASSERT_OK(called_shutdown_cb);
}